

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::internal_node<int,_true>_> *
immutable::rrb_details::append_empty<int,true>
          (ref<immutable::rrb_details::internal_node<int,_true>_> *to_set,uint32_t empty_height)

{
  internal_node<int,_true> *piVar1;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_48;
  ref<immutable::rrb_details::internal_node<int,_true>_> new_empty;
  uint32_t i;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_30;
  ref<immutable::rrb_details::internal_node<int,_true>_> empty;
  ref<immutable::rrb_details::internal_node<int,_true>_> leaf;
  uint32_t empty_height_local;
  ref<immutable::rrb_details::internal_node<int,_true>_> *to_set_local;
  
  to_set_local = to_set;
  if (empty_height != 0) {
    piVar1 = internal_node_create<int,true>(1);
    ref<immutable::rrb_details::internal_node<int,_true>_>::ref(&empty,piVar1);
    ref<immutable::rrb_details::internal_node<int,_true>_>::ref(&local_30,&empty);
    for (new_empty.ptr._0_4_ = 1; (uint)new_empty.ptr < empty_height;
        new_empty.ptr._0_4_ = (uint)new_empty.ptr + 1) {
      piVar1 = internal_node_create<int,true>(1);
      ref<immutable::rrb_details::internal_node<int,_true>_>::ref(&local_48,piVar1);
      piVar1 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&local_48);
      ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(piVar1->child,&local_30);
      ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(&local_30,&local_48);
      ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&local_48);
    }
    ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(to_set,&local_30);
    piVar1 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&empty);
    to_set_local = piVar1->child;
    ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&local_30);
    ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&empty);
  }
  return to_set_local;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>>* append_empty(ref<internal_node<T, atomic_ref_counting>>* to_set, uint32_t empty_height)
      {
      if (0 < empty_height)
        {
        ref<internal_node<T, atomic_ref_counting>> leaf = internal_node_create<T, atomic_ref_counting>(1);
        ref<internal_node<T, atomic_ref_counting>> empty = leaf;
        for (uint32_t i = 1; i < empty_height; i++)
          {
          ref<internal_node<T, atomic_ref_counting>> new_empty = internal_node_create<T, atomic_ref_counting>(1);
          new_empty->child[0] = empty;
          empty = new_empty;
          }
        // this root node must be one larger, otherwise segfault        
        *to_set = empty;
        return &leaf->child[0];
        }
      else
        {
        return to_set;
        }
      }